

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1785d::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,Container *type)

{
  bool bVar1;
  Type *type_00;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  string element_name;
  undefined1 local_118 [8];
  string container_kind;
  string local_f0;
  string local_d0;
  allocator local_99;
  string local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Container *local_18;
  Container *type_local;
  IDLTypeIdentifierVisitor *this_local;
  
  local_18 = type;
  type_local = (Container *)this;
  Typelib::Type::getName_abi_cxx11_();
  bVar1 = std::operator==(&local_38,"/std/string");
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&this->m_namespace,"");
    std::__cxx11::string::operator=((string *)&this->m_front,"string");
  }
  else {
    type_00 = (Type *)Typelib::Indirect::getIndirection();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"",&local_99);
    getIDLBase(&local_78,this,type_00,&local_98);
    std::__cxx11::string::operator=((string *)&this->m_namespace,(string *)&local_78);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f0,"/",(allocator *)(container_kind.field_2._M_local_buf + 0xf));
      getIDLAbsoluteNamespace(&local_d0,&local_f0,this->m_exporter);
      std::__cxx11::string::operator=((string *)&this->m_namespace,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator
                ((allocator<char> *)(container_kind.field_2._M_local_buf + 0xf));
    }
    Typelib::Container::kind_abi_cxx11_();
    Typelib::getTypename((string *)local_118);
    std::__cxx11::string::~string((string *)(element_name.field_2._M_local_buf + 8));
    Typelib::Indirect::getIndirection();
    Typelib::Type::getName_abi_cxx11_();
    boost::algorithm::replace_all<std::__cxx11::string,char_const*,char[2]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
               &Typelib::NamespaceMarkString,(char (*) [2])"_");
    boost::algorithm::replace_all<std::__cxx11::string,char[2],char[2]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
               (char (*) [2])0x1530ea,(char (*) [2])"_");
    std::operator+(&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   "_");
    std::operator+(&local_198,&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    std::operator+(&local_178,&local_198,"_");
    std::__cxx11::string::operator=((string *)&this->m_front,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)local_118);
  }
  return true;
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(Container const& type)
    {
        if (type.getName() == "/std/string")
        {
            m_namespace = "";
            m_front = "string";
        }
        else
        {
            // Get the basename for "kind"
            m_namespace = getIDLBase(type.getIndirection()).first;
            // We generate all containers in orogen::Corba, even if their
            // element type is a builtin
            if (m_namespace.empty())
                m_namespace = getIDLAbsoluteNamespace("/", m_exporter);

            std::string container_kind = Typelib::getTypename(type.kind());
            std::string element_name   = type.getIndirection().getName();
            boost::replace_all(element_name, Typelib::NamespaceMarkString, "_");
            boost::replace_all(element_name, " ", "_");
            m_front = container_kind + "_" + element_name + "_";
        }

        return true;
    }